

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O2

int lddmc_sat_one(MDD mdd,uint32_t *values,size_t count)

{
  uint8_t *puVar1;
  llmsset_t plVar2;
  size_t sVar3;
  
  plVar2 = nodes;
  sVar3 = 0;
  while( true ) {
    if (mdd == 0) {
      return 0;
    }
    if (mdd == 1) break;
    if (count == sVar3) {
      __assert_fail("count != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0x89c,"int lddmc_sat_one(MDD, uint32_t *, size_t)");
    }
    puVar1 = plVar2->data;
    values[sVar3] = *(uint32_t *)(puVar1 + mdd * 0x10 + 6);
    sVar3 = sVar3 + 1;
    mdd = *(ulong *)(puVar1 + mdd * 0x10 + 8) >> 0x11;
  }
  return 1;
}

Assistant:

int
lddmc_sat_one(MDD mdd, uint32_t* values, size_t count)
{
    if (mdd == lddmc_false) return 0;
    if (mdd == lddmc_true) return 1;
    assert(count != 0);
    mddnode_t n = LDD_GETNODE(mdd);
    *values = mddnode_getvalue(n);
    return lddmc_sat_one(mddnode_getdown(n), values+1, count-1);
}